

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

int MPLSParser::calcPlayItemID(MPLSStreamInfo *streamInfo,uint32_t pts)

{
  pointer pmVar1;
  pointer pmVar2;
  int iVar3;
  ulong uVar4;
  size_t *psVar5;
  ulong uVar6;
  int iVar7;
  _Base_ptr in_R9;
  bool bVar8;
  
  iVar7 = (int)in_R9;
  pmVar1 = (streamInfo->super_M2TSStreamInfo).m_index.
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (streamInfo->super_M2TSStreamInfo).m_index.
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)pmVar2 - (long)pmVar1 >> 4) * -0x5555555555555555;
  bVar8 = pmVar2 != pmVar1;
  if (bVar8) {
    psVar5 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    uVar6 = 0;
    do {
      if ((*psVar5 != 0) && (in_R9 = (_Base_ptr)psVar5[-2], (ulong)pts < *(ulong *)(in_R9 + 1))) {
        iVar7 = 1;
        if (1 < (int)uVar6) {
          iVar7 = (int)uVar6;
        }
        iVar7 = iVar7 + -1;
        break;
      }
      iVar7 = (int)in_R9;
      uVar6 = uVar6 + 1;
      bVar8 = uVar6 < uVar4;
      psVar5 = psVar5 + 6;
    } while (uVar4 + (uVar4 == 0) != uVar6);
  }
  iVar3 = (int)uVar4 + -1;
  if (bVar8) {
    iVar3 = iVar7;
  }
  return iVar3;
}

Assistant:

int MPLSParser::calcPlayItemID(const MPLSStreamInfo& streamInfo, const uint32_t pts)
{
    for (size_t i = 0; i < streamInfo.m_index.size(); i++)
    {
        if (!streamInfo.m_index[i].empty())
        {
            if (streamInfo.m_index[i].begin()->first > pts)
                return FFMAX((int)i, 1) - 1;
        }
    }
    return static_cast<int>(streamInfo.m_index.size()) - 1;
}